

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

void __thiscall
Js::JavascriptRegExpConstructor::InvalidateLastMatch
          (JavascriptRegExpConstructor *this,RegexPattern *lastPattern,JavascriptString *lastInput)

{
  Type TVar1;
  code *pcVar2;
  uint lineNumber;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  char *message;
  char *error;
  char *fileName;
  
  if (lastPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x3e,"(lastPattern != nullptr)","lastPattern should not be null");
    if (!bVar3) goto LAB_00bae90a;
    *puVar5 = 0;
  }
  if (lastInput == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x3f,"(lastInput != nullptr)","lastInput should not be null");
    if (!bVar3) goto LAB_00bae90a;
    *puVar5 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00bae90a;
    *puVar5 = 0;
  }
  TVar1 = ((lastInput->super_RecyclableObject).type.ptr)->typeId;
  if ((int)TVar1 < 0x58) {
    if (TVar1 != TypeIds_Null) goto LAB_00bae8d9;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
    ;
    error = "(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null)";
    message = "lastInput should not be JavaScript null";
    lineNumber = 0x40;
  }
  else {
    BVar4 = RecyclableObject::IsExternal(&lastInput->super_RecyclableObject);
    if (BVar4 != 0) goto LAB_00bae8d9;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00bae90a:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00bae8d9:
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet
            (&this->lastPattern,lastPattern);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet(&this->lastInput,lastInput);
  (this->lastMatch).length = 0xffffffff;
  this->invalidatedLastMatch = true;
  this->reset = true;
  return;
}

Assistant:

void JavascriptRegExpConstructor::InvalidateLastMatch(UnifiedRegex::RegexPattern* lastPattern, JavascriptString* lastInput)
    {
        AssertMsg(lastPattern != nullptr, "lastPattern should not be null");
        AssertMsg(lastInput != nullptr, "lastInput should not be null");
        AssertMsg(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null, "lastInput should not be JavaScript null");

        this->lastPattern = lastPattern;
        this->lastInput = lastInput;
        this->lastMatch.Reset();
        this->reset = true;
        this->invalidatedLastMatch = true;
    }